

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

wchar_t prt_speed_aux(char *buf,wchar_t max,uint8_t *attr)

{
  wchar_t wVar1;
  uint uVar2;
  size_t sVar3;
  wchar_t dec_mul;
  wchar_t int_mul;
  wchar_t multiplier;
  char *type;
  wchar_t i;
  uint8_t *attr_local;
  wchar_t max_local;
  char *buf_local;
  
  wVar1 = (player->state).speed;
  _int_mul = (char *)0x0;
  *attr = '\x01';
  *buf = '\0';
  if (wVar1 < L'o') {
    if (wVar1 < L'n') {
      *attr = '\x0f';
      _int_mul = "Slow";
    }
  }
  else {
    *attr = '\r';
    _int_mul = "Fast";
  }
  if ((_int_mul == (char *)0x0) || (((player->opts).opt[0x15] & 1U) != 0)) {
    if ((_int_mul != (char *)0x0) && (((player->opts).opt[0x15] & 1U) != 0)) {
      uVar2 = ((uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                     [wVar1] * 10) / 10;
      strnfmt(buf,(long)max,"%s (%d.%dx)",_int_mul,(ulong)(uVar2 / 10),(ulong)(uVar2 % 10));
    }
  }
  else {
    strnfmt(buf,(long)max,"%s (%+d)",_int_mul,(ulong)(uint)(wVar1 + L'\xffffff92'));
  }
  sVar3 = strlen(buf);
  return (wchar_t)sVar3;
}

Assistant:

static int prt_speed_aux(char buf[], int max, uint8_t *attr)
{
	int i = player->state.speed;
	const char *type = NULL;

	*attr = COLOUR_WHITE;
	buf[0] = 0;

	/* 110 is normal speed, and requires no display */
	if (i > 110) {
		*attr = COLOUR_L_GREEN;
		type = "Fast";
	} else if (i < 110) {
		*attr = COLOUR_L_UMBER;
		type = "Slow";
	}

	if (type && !OPT(player, effective_speed))
		strnfmt(buf, max, "%s (%+d)", type, (i - 110));
	else if (type && OPT(player, effective_speed))
	{
		int multiplier = 10 * extract_energy[i] / extract_energy[110];
		int int_mul = multiplier / 10;
		int dec_mul = multiplier % 10;
		strnfmt(buf, max, "%s (%d.%dx)", type, int_mul, dec_mul);
	}

	return strlen(buf);
}